

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O3

int Abc_NtkCompareSignals(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fOnlyPis,int fComb)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  char *__format;
  ulong uVar6;
  
  Abc_NtkOrderObjsByName(pNtk1,fComb);
  Abc_NtkOrderObjsByName(pNtk2,fComb);
  pVVar5 = pNtk1->vPis;
  if (pVVar5->nSize != pNtk2->vPis->nSize) {
    puts("Networks have different number of primary inputs.");
    return 0;
  }
  if (0 < pVVar5->nSize) {
    uVar6 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar5->pArray[uVar6];
      pcVar3 = Abc_ObjName(pAVar1);
      if ((long)pNtk2->vPis->nSize <= (long)uVar6) goto LAB_00842588;
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPis->pArray[uVar6]);
      iVar2 = strcmp(pcVar3,pcVar4);
      if (iVar2 != 0) {
        pcVar3 = Abc_ObjName(pAVar1);
        if (pNtk2->vPis->nSize <= (int)uVar6) goto LAB_00842588;
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPis->pArray[uVar6]);
        __format = 
        "Primary input #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n";
        goto LAB_008424a7;
      }
      uVar6 = uVar6 + 1;
      pVVar5 = pNtk1->vPis;
    } while ((long)uVar6 < (long)pVVar5->nSize);
  }
  if (fOnlyPis == 0) {
    iVar2 = Abc_NtkCompareBoxes(pNtk1,pNtk2,fComb);
    if (iVar2 == 0) {
      return 0;
    }
    pVVar5 = pNtk1->vPos;
    if (pVVar5->nSize != pNtk2->vPos->nSize) {
      puts("Networks have different number of primary outputs.");
      return 0;
    }
    if (0 < pVVar5->nSize) {
      uVar6 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[uVar6];
        pcVar3 = Abc_ObjName(pAVar1);
        if ((long)pNtk2->vPos->nSize <= (long)uVar6) {
LAB_00842588:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPos->pArray[uVar6]);
        iVar2 = strcmp(pcVar3,pcVar4);
        if (iVar2 != 0) {
          pcVar3 = Abc_ObjName(pAVar1);
          if ((int)uVar6 < pNtk2->vPos->nSize) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPos->pArray[uVar6]);
            __format = 
            "Primary output #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n";
LAB_008424a7:
            printf(__format,uVar6 & 0xffffffff,pcVar3,pcVar4);
            return 0;
          }
          goto LAB_00842588;
        }
        uVar6 = uVar6 + 1;
        pVVar5 = pNtk1->vPos;
      } while ((long)uVar6 < (long)pVVar5->nSize);
    }
  }
  return 1;
}

Assistant:

int Abc_NtkCompareSignals( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fOnlyPis, int fComb )
{
    Abc_NtkOrderObjsByName( pNtk1, fComb );
    Abc_NtkOrderObjsByName( pNtk2, fComb );
    if ( !Abc_NtkComparePis( pNtk1, pNtk2, fComb ) )
        return 0;
    if ( !fOnlyPis )
    {
        if ( !Abc_NtkCompareBoxes( pNtk1, pNtk2, fComb ) )
            return 0;
        if ( !Abc_NtkComparePos( pNtk1, pNtk2, fComb ) )
            return 0;
    }
    return 1;
}